

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O3

void __thiscall mario::TimerQueue::handleRead(TimerQueue *this)

{
  _Any_data *p_Var1;
  Timestamp now;
  undefined8 uVar2;
  pointer ppVar3;
  vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  expired;
  vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  local_38;
  
  EventLoop::assertInLoopThread(this->_loop);
  now = Timestamp::now();
  detail::readTimerfd(this->_timerfd);
  getExpired(&local_38,this,now);
  this->_callingExpiredTimers = true;
  std::
  _Rb_tree<std::pair<mario::Timer_*,_long>,_std::pair<mario::Timer_*,_long>,_std::_Identity<std::pair<mario::Timer_*,_long>_>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
  ::clear(&(this->_cancelingTimers)._M_t);
  ppVar3 = local_38.
           super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_38.
      super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_38.
      super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      p_Var1 = (_Any_data *)ppVar3->second;
      if (*(long *)(p_Var1 + 1) == 0) {
        uVar2 = std::__throw_bad_function_call();
        if (local_38.
            super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_38.
                          super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar2);
      }
      (**(code **)((long)p_Var1 + 0x18))(p_Var1);
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != local_38.
                       super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  this->_callingExpiredTimers = false;
  reset(this,&local_38,now);
  if (local_38.
      super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TimerQueue::handleRead() {
    _loop->assertInLoopThread();
    Timestamp now(Timestamp::now());
    readTimerfd(_timerfd);

    std::vector<Entry> expired = getExpired(now);

    _callingExpiredTimers = true;
    _cancelingTimers.clear();
    for (auto it = expired.begin(); it != expired.end(); ++it) {
        it->second->run();
    }
    _callingExpiredTimers = false;

    reset(expired, now);
}